

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O2

pair<long_*,_long_*> __thiscall memt::Arena::allocArrayNoCon<long>(Arena *this,size_t elementCount)

{
  undefined8 *puVar1;
  pair<long_*,_long_*> pVar2;
  
  if (elementCount >> 0x3d == 0) {
    pVar2.first = (long *)alloc(this,elementCount * 8);
    pVar2.second = pVar2.first + elementCount;
    return pVar2;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = dup2;
  __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

std::pair<T*, T*> Arena::allocArrayNoCon(size_t elementCount) {
    if (elementCount > static_cast<size_t>(-1) / sizeof(T))
      throw std::bad_alloc();
    const size_t size = elementCount * sizeof(T);
    MEMT_ASSERT(size / sizeof(T) == elementCount);
    char* buffer = static_cast<char*>(alloc(size));
    T* array = reinterpret_cast<T*>(buffer);
    T* arrayEnd = reinterpret_cast<T*>(buffer + size);
    return std::make_pair(array, arrayEnd);
  }